

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O1

ActionResults * __thiscall WhiteRoomOneAction::Throw(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  itemType local_5c;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == DISCUS) {
    local_5c = DISCUS;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 != BACKPACK) goto LAB_00120208;
    iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != LIGHT) goto LAB_00120208;
    local_5c = LADDER;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
    ItemWrapper::setLocation(pIVar3,W_ROOM1);
    this_00 = (ActionResults *)operator_new(0x30);
    paVar5 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "Good shootin\' Tex! The floor drops out in part of the room and the top of an escape ladder juts out of the newly formed hole."
               ,"");
    ActionResults::ActionResults(this_00,CURRENT,&local_38);
    _Var4._M_p = local_38._M_dataplus._M_p;
LAB_001202a1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar5) {
      operator_delete(_Var4._M_p);
    }
  }
  else {
LAB_00120208:
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == DISCUS) {
      local_5c = DISCUS;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
      iVar2 = ItemWrapper::getLocation(pIVar3);
      if (iVar2 == BACKPACK) {
        local_5c = DISCUS;
        pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
        ItemWrapper::setLocation(pIVar3,W_ROOM1);
        this_00 = (ActionResults *)operator_new(0x30);
        paVar5 = &local_58.field_2;
        local_58._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "The discus floats in the air like a frisbee before crashing into a wall and rolling around on the floor."
                   ,"");
        ActionResults::ActionResults(this_00,CURRENT,&local_58);
        _Var4._M_p = local_58._M_dataplus._M_p;
        goto LAB_001202a1;
      }
    }
    this_00 = AbstractRoomAction::Throw(&this->super_AbstractRoomAction);
  }
  return this_00;
}

Assistant:

ActionResults *WhiteRoomOneAction::Throw() {
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK && commands->getActedOnItem() == LIGHT){
        itemList->getValue(LADDER)->setLocation(W_ROOM1); //unhide ladder
        return new ActionResults(CURRENT, "Good shootin' Tex! The floor drops out in part of the room and the top of an escape ladder juts out of the newly formed hole.");
    }
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK) {
        itemList->getValue(DISCUS)->setLocation(W_ROOM1);
        return new ActionResults(CURRENT, "The discus floats in the air like a frisbee before crashing into a wall and rolling around on the floor.");
    }
    else {
        return AbstractRoomAction::Throw();
    }
}